

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O3

void si9ma::BinaryTree::print_in_order(TreeNode *head,int height,int len,string *to)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  TreeNode *pTVar3;
  uint __val;
  uint uVar4;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  uint uVar8;
  long *plVar9;
  ulong *puVar10;
  int iVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  ulong uVar12;
  long extraout_RDX;
  uint __len;
  undefined4 in_register_00000034;
  undefined8 uVar13;
  long lVar14;
  string __str;
  string val;
  string local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  int local_e4;
  TreeNode *local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined8 local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = CONCAT44(in_register_00000034,height);
  if (head == (TreeNode *)0x0) {
    return;
  }
  pTVar3 = head->right;
  local_e0 = head;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"v","");
  local_e4 = height + 1;
  print_in_order(pTVar3,height + 1,len,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar2 = local_e0->value;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar8 = (uint)uVar12;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_00109953;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_00109953;
      }
      if (uVar8 < 10000) goto LAB_00109953;
      uVar12 = uVar12 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_00109953:
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_128,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_128._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
  puVar5 = (undefined8 *)
           std::__cxx11::string::replace
                     ((ulong)&local_128,0,(char *)0x0,(ulong)(to->_M_dataplus)._M_p);
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_f8 = *plVar6;
    lStack_f0 = puVar5[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *plVar6;
    local_108 = (long *)*puVar5;
  }
  local_100 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)(to->_M_dataplus)._M_p)
  ;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_c8 = *plVar9;
    lStack_c0 = plVar6[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar9;
    local_d8 = (long *)*plVar6;
  }
  lVar14 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_d0 = lVar14;
  if (local_108 != &local_f8) {
    operator_delete(local_108);
    lVar14 = extraout_RDX;
  }
  iVar11 = (int)lVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
    iVar11 = extraout_EDX;
  }
  lVar14 = len - local_d0;
  uVar12 = lVar14 / 2;
  get_space_abi_cxx11_(&local_70,(BinaryTree *)(uVar12 & 0xffffffff),iVar11);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d8);
  paVar1 = &local_128.field_2;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_128.field_2._M_allocated_capacity = *puVar10;
    local_128.field_2._8_8_ = plVar6[3];
    local_128._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_128.field_2._M_allocated_capacity = *puVar10;
    local_128._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_128._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  get_space_abi_cxx11_
            (&local_b0,(BinaryTree *)(lVar14 - uVar12 & 0xffffffff),(int)local_128._M_string_length)
  ;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    uVar13 = local_128.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_b0._M_string_length + local_128._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar13 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_128._M_string_length <= (ulong)uVar13) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      goto LAB_00109b6a;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_b0._M_dataplus._M_p);
LAB_00109b6a:
  local_108 = &local_f8;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_f8 = *plVar6;
    lStack_f0 = puVar5[3];
  }
  else {
    local_f8 = *plVar6;
    local_108 = (long *)*puVar5;
  }
  local_100 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_108);
  iVar11 = extraout_EDX_00;
  if (local_108 != &local_f8) {
    operator_delete(local_108);
    iVar11 = extraout_EDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
    iVar11 = extraout_EDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
    iVar11 = extraout_EDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
    iVar11 = extraout_EDX_04;
  }
  get_space_abi_cxx11_(&local_128,(BinaryTree *)(ulong)(uint)((int)local_b8 * len),iVar11);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_d8);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_f8 = *plVar9;
    lStack_f0 = plVar6[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *plVar9;
    local_108 = (long *)*plVar6;
  }
  local_100 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_108,local_100);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  pTVar3 = local_e0->left;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"^","");
  print_in_order(pTVar3,local_e4,len,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

void BinaryTree::print_in_order(const TreeNode *head, int height, int len, string to) {
        if (head == nullptr)
            return;

        print_in_order(head->right,height + 1,len,"v");
        string val = to + to_string(head->value) + to;
        long len_m = val.length();
        long len_l = (len - len_m) / 2;
        long len_r = len - len_m - len_l;
        val = get_space(len_l) + val + get_space(len_r);
        cout << get_space(height * len) + val << endl;
        print_in_order(head->left,height + 1,len,"^");
    }